

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_selectinrect(_glist *x,int lox,int loy,int hix,int hiy)

{
  t_gobj *x_00;
  int iVar1;
  t_gobj **pptVar2;
  int y2;
  int x2;
  int y1;
  int x1;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pptVar2 = &x->gl_list;
  while (x_00 = *pptVar2, x_00 != (t_gobj *)0x0) {
    gobj_getrect(x_00,x,&local_34,&local_38,&local_3c,&local_40);
    if ((((local_34 <= hix) && (lox <= local_3c)) && (local_38 <= hiy)) && (loy <= local_40)) {
      iVar1 = glist_isselected(x,x_00);
      if (iVar1 == 0) {
        glist_select(x,x_00);
      }
    }
    pptVar2 = &x_00->g_next;
  }
  return;
}

Assistant:

void canvas_selectinrect(t_canvas *x, int lox, int loy, int hix, int hiy)
{
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        int x1, y1, x2, y2;
        gobj_getrect(y, x, &x1, &y1, &x2, &y2);
        if (hix >= x1 && lox <= x2 && hiy >= y1 && loy <= y2
            && !glist_isselected(x, y))
                glist_select(x, y);
    }
}